

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O1

void llvm::MD5::stringifyResult(MD5Result *Result,SmallString<32U> *Str)

{
  SmallString<32U> local_48;
  
  MD5Result::digest(&local_48,Result);
  SmallVectorImpl<char>::operator=((SmallVectorImpl<char> *)Str,(SmallVectorImpl<char> *)&local_48);
  if ((SmallVectorStorage<char,_32U> *)
      local_48.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX !=
      &local_48.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>) {
    free(local_48.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void MD5::stringifyResult(MD5Result &Result, SmallString<32> &Str) {
  Str = Result.digest();
}